

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_shar.c
# Opt level: O0

void uuencode_group(char *_in,char *out)

{
  byte bVar1;
  uint uVar2;
  char local_34;
  char local_30;
  char local_2c;
  char local_28;
  int t;
  uchar *in;
  char *out_local;
  char *_in_local;
  
  bVar1 = _in[2];
  uVar2 = (uint)(byte)*_in << 0x10 | (uint)(byte)_in[1] << 8 | (uint)bVar1;
  if ((int)uVar2 >> 0x12 == 0) {
    local_28 = '`';
  }
  else {
    local_28 = (char)((int)uVar2 >> 0x12) + ' ';
  }
  *out = local_28;
  if (((int)uVar2 >> 0xc & 0x3fU) == 0) {
    local_2c = '`';
  }
  else {
    local_2c = ((byte)((int)uVar2 >> 0xc) & 0x3f) + 0x20;
  }
  out[1] = local_2c;
  if (((int)uVar2 >> 6 & 0x3fU) == 0) {
    local_30 = '`';
  }
  else {
    local_30 = ((byte)((int)uVar2 >> 6) & 0x3f) + 0x20;
  }
  out[2] = local_30;
  if ((bVar1 & 0x3f) == 0) {
    local_34 = '`';
  }
  else {
    local_34 = (bVar1 & 0x3f) + 0x20;
  }
  out[3] = local_34;
  return;
}

Assistant:

static void
uuencode_group(const char _in[3], char out[4])
{
	const unsigned char *in = (const unsigned char *)_in;
	int t;

	t = (in[0] << 16) | (in[1] << 8) | in[2];
	out[0] = UUENC( 0x3f & (t >> 18) );
	out[1] = UUENC( 0x3f & (t >> 12) );
	out[2] = UUENC( 0x3f & (t >> 6) );
	out[3] = UUENC( 0x3f & t );
}